

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.cc
# Opt level: O2

void __thiscall ipx::Control::hIntervalLog(Control *this,stringstream *logging)

{
  double dVar1;
  undefined8 local_98 [4];
  HighsLogOptions log_options_;
  
  if (0.0 <= (this->parameters_).super_ipx_parameters.print_interval) {
    dVar1 = Timer::Elapsed(&this->interval_);
    if ((this->parameters_).super_ipx_parameters.print_interval <= dVar1) {
      Timer::Reset(&this->interval_);
      if ((this->parameters_).super_ipx_parameters.highs_logging == true) {
        HighsLogOptions::HighsLogOptions
                  (&log_options_,(this->parameters_).super_ipx_parameters.log_options);
        std::__cxx11::stringbuf::str();
        highsLogUser(&log_options_,kInfo,"%s",local_98[0]);
        std::__cxx11::string::~string((string *)local_98);
        std::_Function_base::~_Function_base(&log_options_.user_callback.super__Function_base);
      }
      else {
        std::__cxx11::stringbuf::str();
        std::operator<<(&(this->output_).super_ostream,(string *)&log_options_);
        std::__cxx11::string::~string((string *)&log_options_);
      }
    }
  }
  log_options_.log_stream = (FILE *)&log_options_.log_to_console;
  log_options_.output_flag = (bool *)0x0;
  log_options_.log_to_console._0_1_ = 0;
  std::__cxx11::stringbuf::str((string *)(logging + 0x18));
  std::__cxx11::string::~string((string *)&log_options_);
  return;
}

Assistant:

void Control::hIntervalLog(std::stringstream& logging) const {
  if (parameters_.print_interval >= 0.0 &&
      interval_.Elapsed() >= parameters_.print_interval) {
    interval_.Reset();
    if (parameters_.highs_logging) {
      assert(parameters_.log_options);
      HighsLogOptions log_options_ = *(parameters_.log_options);
      highsLogUser(log_options_, HighsLogType::kInfo, "%s", logging.str().c_str());
    } else {
      output_ << logging.str();
    }
  }
  logging.str(std::string());
}